

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<double,_std::allocator<double>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<double>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<double>_> *opt)

{
  initializer_list<double> __l;
  bool bVar1;
  undefined8 opt_00;
  typed_value<std::vector<double,_std::allocator<double>_>,_char> *ptVar2;
  any in_RSI;
  allocator_type *__a;
  typed_value<std::vector<double,_std::allocator<double>_>,_char> *value;
  typed_option<double> *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  typed_value_base this_00;
  vector<double,_std::allocator<double>_> *pvVar3;
  size_type in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffe0;
  
  opt_00 = boost::program_options::value<std::vector<double,std::allocator<double>>>();
  std::
  __shared_ptr_access<VW::config::typed_option<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<VW::config::typed_option<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x17a07c);
  bVar1 = typed_option<double>::default_value_supplied((typed_option<double> *)0x17a084);
  if (bVar1) {
    std::
    __shared_ptr_access<VW::config::typed_option<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<VW::config::typed_option<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x17a0a0);
    __a = (allocator_type *)typed_option<double>::default_value(in_stack_ffffffffffffff90);
    this_00._vptr_typed_value_base = (_func_int **)&stack0xffffffffffffffb8;
    pvVar3 = (vector<double,_std::allocator<double>_> *)0x1;
    std::allocator<double>::allocator((allocator<double> *)0x17a0d0);
    __l._M_len = in_stack_ffffffffffffffd0;
    __l._M_array = (iterator)pvVar3;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_00._vptr_typed_value_base,__l,__a);
    boost::program_options::typed_value<std::vector<double,_std::allocator<double>_>,_char>::
    default_value((typed_value<std::vector<double,_std::allocator<double>_>,_char> *)
                  this_00._vptr_typed_value_base,(vector<double,_std::allocator<double>_> *)__a);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffa0);
    std::allocator<double>::~allocator((allocator<double> *)0x17a10f);
  }
  ptVar2 = add_notifier<double>
                     ((options_boost_po *)in_RSI.content,
                      (shared_ptr<VW::config::typed_option<double>_> *)opt_00,
                      (typed_value<std::vector<double,_std::allocator<double>_>,_char> *)
                      in_stack_ffffffffffffffe0);
  ptVar2 = boost::program_options::typed_value<std::vector<double,_std::allocator<double>_>,_char>::
           composing(ptVar2);
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}